

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *fmt;
  ostringstream *poVar1;
  Precision PVar2;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar3;
  Statement *pSVar4;
  ShaderExecutor *pSVar5;
  bool bVar6;
  int iVar7;
  MessageBuilder *this_01;
  undefined8 uVar8;
  IVal *pIVar9;
  IVal *x;
  Vector<float,_2> *value;
  long lVar10;
  TestStatus *__return_storage_ptr___00;
  ulong uVar11;
  string *this_02;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
  *pBVar12;
  IVal reference1;
  int numErrors;
  FuncSet funcs;
  IVal in3;
  IVal in2;
  Environment env;
  FloatFormat highpFmt;
  void *outputArr [2];
  void *inputArr [4];
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> outputs;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  IVal in0;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffaa8;
  IVal local_549;
  TestLog *local_548;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
  *local_540;
  uint local_534;
  ulong local_530;
  ulong local_528;
  ulong local_520;
  long local_518;
  undefined1 local_510 [8];
  undefined8 local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_500;
  _Rb_tree_node_base *local_4f0;
  size_t local_4e8;
  TestStatus *local_4e0;
  TestLog *local_4d8;
  double dStack_4d0;
  double dStack_4c8;
  string local_4b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  FloatFormat local_468;
  Vector<float,_2> local_438;
  pointer local_430;
  pointer local_428;
  pointer local_420;
  pointer local_418;
  pointer local_410;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> local_408;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_3d8;
  undefined1 local_378 [32];
  Vector<float,_2> *local_358;
  Precision PStack_350;
  undefined4 uStack_34c;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_348;
  undefined4 local_340;
  ResultCollector local_1f8;
  Vector<tcu::Interval,_2> local_1a8 [7];
  
  this_00 = this->m_samplings;
  fmt = &(this->m_caseCtx).floatFormat;
  PVar2 = (this->m_caseCtx).precision;
  sVar3 = (this->m_caseCtx).numRandoms;
  local_4e0 = __return_storage_ptr__;
  iVar7 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_3d8,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)fmt,(FloatFormat *)(ulong)PVar2,(Precision)sVar3,(ulong)(iVar7 + 0xdeadbeef),
             in_stack_fffffffffffffaa8);
  uVar11 = (long)local_3d8.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_3d8.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_408,uVar11);
  local_468.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_468.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_468.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_468.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_468.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_468.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_468.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_468.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_468._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_534 = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_548 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_428 = local_3d8.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_420 = local_3d8.in1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_418 = local_3d8.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_410 = local_3d8.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_438.m_data =
       (float  [2])
       local_408.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_430 = local_408.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar1 = (ostringstream *)(local_378 + 8);
  local_378._0_8_ = local_548;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Statement: ");
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_378,&this->m_stmt);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_540 = this;
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_508 = (double)((ulong)local_508._4_4_ << 0x20);
  aStack_500._M_allocated_capacity = 0;
  local_4e8 = 0;
  pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  aStack_500._8_8_ = (_Rb_tree_node_base *)&local_508;
  local_4f0 = (_Rb_tree_node_base *)&local_508;
  (*pSVar4->_vptr_Statement[4])(pSVar4,local_510);
  for (uVar8 = aStack_500._8_8_; pBVar12 = local_540,
      (_Rb_tree_node_base *)uVar8 != (_Rb_tree_node_base *)&local_508;
      uVar8 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar8)) {
    (**(code **)(**(long **)(uVar8 + 0x20) + 0x30))(*(long **)(uVar8 + 0x20),local_1a8);
  }
  if (local_4e8 != 0) {
    poVar1 = (ostringstream *)(local_378 + 8);
    local_378._0_8_ = local_548;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)poVar1,(string *)&local_4b8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_510);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  pSVar5 = (pBVar12->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  value = &local_438;
  (*pSVar5->_vptr_ShaderExecutor[2])(pSVar5,uVar11 & 0xffffffff,&local_428,value,0);
  tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)local_378);
  tcu::Vector<tcu::Interval,_2>::Vector(local_1a8);
  local_510[0] = (string)0x0;
  local_508 = INFINITY;
  aStack_500._M_allocated_capacity = 0xfff0000000000000;
  local_530 = uVar11;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_498,
             (pBVar12->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_378);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_498,
             (pBVar12->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar12->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4b8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar12->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4d8);
  Environment::bind<float>
            ((Environment *)&local_498,
             (pBVar12->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr,(IVal *)local_510);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar12->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_549);
  lVar10 = 0;
  local_518 = 0;
  local_528 = 0;
  uVar11 = local_530;
  while (uVar11 != 0) {
    local_4d8 = (TestLog *)((ulong)local_4d8 & 0xffffffffffffff00);
    dStack_4d0 = INFINITY;
    dStack_4c8 = -INFINITY;
    local_520 = uVar11 - 1;
    round<tcu::Vector<float,2>>
              ((IVal *)local_1a8,(shaderexecutor *)fmt,
               (FloatFormat *)
               ((long)(local_3d8.in0.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10),value);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_378,fmt,(IVal *)local_1a8);
    pIVar9 = Environment::lookup<tcu::Vector<float,2>>
                       ((Environment *)&local_498,
                        (pBVar12->m_variables).in0.
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                        .m_ptr);
    pIVar9->m_data[1].m_lo = (double)local_358;
    pIVar9->m_data[1].m_hi = (double)CONCAT44(uStack_34c,PStack_350);
    pIVar9->m_data[0].m_hi = (double)CONCAT44(local_378._20_4_,local_378._16_4_);
    *(ulong *)(pIVar9->m_data + 1) = CONCAT44(local_378._28_4_,local_378._24_4_);
    *(undefined8 *)pIVar9->m_data = local_378._0_8_;
    pIVar9->m_data[0].m_lo = (double)CONCAT44(local_378._12_4_,local_378._8_4_);
    round<tcu::Vector<float,2>>
              ((IVal *)local_1a8,(shaderexecutor *)fmt,
               (FloatFormat *)
               ((long)(local_3d8.in1.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10),value);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_378,fmt,(IVal *)local_1a8);
    pIVar9 = Environment::lookup<tcu::Vector<float,2>>
                       ((Environment *)&local_498,
                        (pBVar12->m_variables).in1.
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                        .m_ptr);
    pIVar9->m_data[1].m_lo = (double)local_358;
    pIVar9->m_data[1].m_hi = (double)CONCAT44(uStack_34c,PStack_350);
    pIVar9->m_data[0].m_hi = (double)CONCAT44(local_378._20_4_,local_378._16_4_);
    *(ulong *)(pIVar9->m_data + 1) = CONCAT44(local_378._28_4_,local_378._24_4_);
    *(undefined8 *)pIVar9->m_data = local_378._0_8_;
    pIVar9->m_data[0].m_lo = (double)CONCAT44(local_378._12_4_,local_378._8_4_);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_498,
               (pBVar12->m_variables).in2.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_498,
               (pBVar12->m_variables).in3.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    PStack_350 = (pBVar12->m_caseCtx).precision;
    value = (Vector<float,_2> *)(this->m_caseCtx).floatFormat.m_maxValue;
    local_378._0_8_ = *(undefined8 *)fmt;
    local_378._8_4_ = (this->m_caseCtx).floatFormat.m_fractionBits;
    local_378._12_4_ = (this->m_caseCtx).floatFormat.m_hasSubnormal;
    local_378._16_4_ = (this->m_caseCtx).floatFormat.m_hasInf;
    local_378._20_4_ = (this->m_caseCtx).floatFormat.m_hasNaN;
    local_378[0x18] = (this->m_caseCtx).floatFormat.m_exactPrecision;
    local_378._25_3_ = *(undefined3 *)&(this->m_caseCtx).floatFormat.field_0x19;
    local_378._28_4_ = *(undefined4 *)&(this->m_caseCtx).floatFormat.field_0x1c;
    local_340 = 0;
    pSVar4 = (pBVar12->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    local_358 = value;
    local_348 = &local_498;
    (*pSVar4->_vptr_Statement[3])(pSVar4,(MessageBuilder *)local_378);
    x = Environment::lookup<float>
                  ((Environment *)&local_498,
                   (pBVar12->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
    tcu::FloatFormat::convert((Interval *)local_378,&local_468,x);
    dStack_4c8 = (double)CONCAT44(local_378._20_4_,local_378._16_4_);
    dStack_4d0 = (double)CONCAT44(local_378._12_4_,local_378._8_4_);
    local_4d8 = (TestLog *)local_378._0_8_;
    bVar6 = contains<float>((IVal *)&local_4d8,
                            (float *)((long)local_408.out0.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start + local_518));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_378,"Shader output 0 is outside acceptable range",
               (allocator<char> *)local_1a8);
    bVar6 = tcu::ResultCollector::check(&local_1f8,bVar6,(string *)local_378);
    std::__cxx11::string::~string((string *)local_378);
    if (!bVar6) {
      local_534 = (int)local_528 + 1;
      local_528 = (ulong)local_534;
      poVar1 = (ostringstream *)(local_378 + 8);
      if ((int)local_534 < 0x65) {
        local_378._0_8_ = local_548;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Failed");
        std::operator<<((ostream *)poVar1," sample:\n");
        std::operator<<((ostream *)poVar1,"\t");
        std::__cxx11::string::string
                  ((string *)local_1a8,
                   (string *)
                   &((local_540->m_variables).in0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                    m_ptr)->m_name);
        std::operator<<((ostream *)poVar1,(string *)local_1a8);
        std::operator<<((ostream *)poVar1," = ");
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_510,(shaderexecutor *)&local_468,
                   (FloatFormat *)
                   ((long)(local_3d8.in0.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10),value);
        std::operator<<((ostream *)poVar1,(string *)local_510);
        std::operator<<((ostream *)poVar1,"\n");
        std::__cxx11::string::~string((string *)local_510);
        std::__cxx11::string::~string((string *)local_1a8);
        std::operator<<((ostream *)poVar1,"\t");
        std::__cxx11::string::string
                  ((string *)local_1a8,
                   (string *)
                   &((local_540->m_variables).in1.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                    m_ptr)->m_name);
        std::operator<<((ostream *)poVar1,(string *)local_1a8);
        std::operator<<((ostream *)poVar1," = ");
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_510,(shaderexecutor *)&local_468,
                   (FloatFormat *)
                   ((long)(local_3d8.in1.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10),value);
        std::operator<<((ostream *)poVar1,(string *)local_510);
        std::operator<<((ostream *)poVar1,"\n");
        std::__cxx11::string::~string((string *)local_510);
        std::__cxx11::string::~string((string *)local_1a8);
        std::operator<<((ostream *)poVar1,"\t");
        std::__cxx11::string::string
                  ((string *)local_1a8,
                   (string *)
                   &((local_540->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr)->m_name);
        std::operator<<((ostream *)poVar1,(string *)local_1a8);
        std::operator<<((ostream *)poVar1," = ");
        valueToString<float>
                  ((string *)local_510,&local_468,
                   (float *)((long)local_408.out0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + local_518));
        std::operator<<((ostream *)poVar1,(string *)local_510);
        std::operator<<((ostream *)poVar1,"\n");
        std::operator<<((ostream *)poVar1,"\tExpected range: ");
        intervalToString<float>(&local_4b8,&local_468,(IVal *)&local_4d8);
        std::operator<<((ostream *)poVar1,(string *)&local_4b8);
        std::operator<<((ostream *)poVar1,"\n");
        std::__cxx11::string::~string((string *)&local_4b8);
        std::__cxx11::string::~string((string *)local_510);
        std::__cxx11::string::~string((string *)local_1a8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
    }
    local_518 = local_518 + 4;
    lVar10 = lVar10 + 8;
    uVar11 = local_520;
    pBVar12 = local_540;
  }
  iVar7 = (int)local_528;
  if (iVar7 < 0x65) {
    if (iVar7 == 0) {
      poVar1 = (ostringstream *)(local_378 + 8);
      local_378._0_8_ = local_548;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," inputs passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_378,"Pass",(allocator<char> *)local_1a8);
      __return_storage_ptr___00 = local_4e0;
      tcu::TestStatus::pass(local_4e0,(string *)local_378);
      this_02 = (string *)local_378;
      goto LAB_007cf5b2;
    }
  }
  else {
    poVar1 = (ostringstream *)(local_378 + 8);
    local_378._0_8_ = local_548;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"(Skipped ");
    std::ostream::operator<<(poVar1,iVar7 + -100);
    std::operator<<((ostream *)poVar1," messages.)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  poVar1 = (ostringstream *)(local_378 + 8);
  local_378._0_8_ = local_548;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,iVar7);
  std::operator<<((ostream *)poVar1,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1," inputs failed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  de::toString<int>((string *)local_1a8,(int *)&local_534);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_510," test failed. Check log for the details",
             (allocator<char> *)&local_4b8);
  __return_storage_ptr___00 = local_4e0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)local_378);
  std::__cxx11::string::~string((string *)local_378);
  std::__cxx11::string::~string((string *)local_510);
  this_02 = (string *)local_1a8;
LAB_007cf5b2:
  std::__cxx11::string::~string(this_02);
  tcu::ResultCollector::~ResultCollector(&local_1f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>::~Outputs(&local_408);
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::~Inputs(&local_3d8);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}